

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O1

bool __thiscall
despot::BaseTag::Step(BaseTag *this,State *s,double random_num,ACT_TYPE action,double *reward)

{
  long lVar1;
  bool bVar2;
  double *pdVar3;
  long lVar4;
  double dVar5;
  
  if (action == 4) {
    bVar2 = true;
    dVar5 = TAG_REWARD;
    if ((this->rob_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[*(int *)(s + 0xc)] ==
        (this->opp_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[*(int *)(s + 0xc)]) goto LAB_001100e9;
    dVar5 = -TAG_REWARD;
  }
  else {
    dVar5 = -1.0;
  }
  bVar2 = false;
LAB_001100e9:
  *reward = dVar5;
  lVar4 = *(long *)&(this->transition_probabilities_).
                    super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[*(int *)(s + 0xc)].
                    super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                    ._M_impl.super__Vector_impl_data;
  lVar1 = *(long *)(lVar4 + (long)action * 0x18);
  lVar4 = *(long *)(lVar4 + 8 + (long)action * 0x18) - lVar1;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 5;
    lVar4 = lVar4 + (ulong)(lVar4 == 0);
    pdVar3 = (double *)(lVar1 + 0x18);
    dVar5 = 0.0;
    do {
      dVar5 = dVar5 + *pdVar3;
      if (random_num <= dVar5) {
        *(undefined4 *)(s + 0xc) = *(undefined4 *)((long)pdVar3 + -0xc);
        return bVar2;
      }
      pdVar3 = pdVar3 + 4;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  return bVar2;
}

Assistant:

bool BaseTag::Step(State& s, double random_num, ACT_TYPE action,
	double& reward) const {
	TagState& state = static_cast<TagState&>(s);

	bool terminal = false;
	if (action == TagAction()) {
		if (rob_[state.state_id] == opp_[state.state_id]) {
			reward = TAG_REWARD;
			terminal = true;
		} else {
			reward = -TAG_REWARD;
		}
	} else {
		reward = -1;
	}

	const vector<State>& distribution =
		transition_probabilities_[state.state_id][action];
	double sum = 0;
	for (int i = 0; i < distribution.size(); i++) {
		const State& next = distribution[i];
		sum += next.weight;
		if (sum >= random_num) {
			state.state_id = next.state_id;
			break;
		}
	}

	return terminal;
}